

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

int Iso_ManCheckMapping(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vMap2to1,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *pFanin1_00;
  uint local_4c;
  int i;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *pObj;
  int fVerbose_local;
  Vec_Int_t *vMap2to1_local;
  Aig_Man_t *pAig2_local;
  Aig_Man_t *pAig1_local;
  
  iVar1 = Aig_ManCiNum(pAig1);
  iVar2 = Aig_ManCiNum(pAig2);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(pAig1) == Aig_ManCiNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xbe,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  iVar1 = Aig_ManCoNum(pAig1);
  iVar2 = Aig_ManCoNum(pAig2);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCoNum(pAig1) == Aig_ManCoNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xbf,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  iVar1 = Aig_ManRegNum(pAig1);
  iVar2 = Aig_ManRegNum(pAig2);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManRegNum(pAig1) == Aig_ManRegNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xc0,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  iVar1 = Aig_ManNodeNum(pAig1);
  iVar2 = Aig_ManNodeNum(pAig2);
  if (iVar1 == iVar2) {
    Aig_ManCleanData(pAig1);
    pAVar3 = Aig_ManConst1(pAig1);
    pAVar4 = Aig_ManConst1(pAig2);
    (pAVar4->field_5).pData = pAVar3;
    for (local_4c = 0; iVar1 = Vec_PtrSize(pAig2->vCis), (int)local_4c < iVar1;
        local_4c = local_4c + 1) {
      pvVar5 = Vec_PtrEntry(pAig2->vCis,local_4c);
      iVar1 = Vec_IntEntry(vMap2to1,local_4c);
      pAVar3 = Aig_ManCi(pAig1,iVar1);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
    }
    for (local_4c = 0; iVar1 = Vec_PtrSize(pAig2->vObjs), (int)local_4c < iVar1;
        local_4c = local_4c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig2->vObjs,local_4c);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        pFanin1_00 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_TableLookupTwo(pAig1,pAVar4,pFanin1_00);
        (pAVar3->field_5).pData = pAVar4;
        if ((pAVar3->field_5).pData == (void *)0x0) {
          if (fVerbose != 0) {
            printf("Structural equivalence failed at node %d.\n",(ulong)local_4c);
          }
          return 0;
        }
      }
    }
    iVar1 = Aig_ManCoNum(pAig1);
    iVar2 = Aig_ManRegNum(pAig1);
    if (iVar1 - iVar2 == 1) {
      pAVar3 = Aig_ManCo(pAig2,0);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      pAVar4 = Aig_ManCo(pAig1,0);
      pAVar4 = Aig_ObjChild0(pAVar4);
      if (pAVar3 != pAVar4) {
        if (fVerbose != 0) {
          printf("Structural equivalence failed at primary output 0.\n");
        }
        return 0;
      }
    }
    return 1;
  }
  __assert_fail("Aig_ManNodeNum(pAig1) == Aig_ManNodeNum(pAig2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                ,0xc1,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
}

Assistant:

int Iso_ManCheckMapping( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vMap2to1, int fVerbose )
{
    Aig_Obj_t * pObj, * pFanin0, * pFanin1;
    int i;
    assert( Aig_ManCiNum(pAig1) == Aig_ManCiNum(pAig2) );
    assert( Aig_ManCoNum(pAig1) == Aig_ManCoNum(pAig2) );
    assert( Aig_ManRegNum(pAig1) == Aig_ManRegNum(pAig2) );
    assert( Aig_ManNodeNum(pAig1) == Aig_ManNodeNum(pAig2) );
    Aig_ManCleanData( pAig1 );
    // map const and PI nodes
    Aig_ManConst1(pAig2)->pData = Aig_ManConst1(pAig1);
    Aig_ManForEachCi( pAig2, pObj, i )
        pObj->pData = Aig_ManCi( pAig1, Vec_IntEntry(vMap2to1, i) );
    // try internal nodes
    Aig_ManForEachNode( pAig2, pObj, i )
    {
        pFanin0 = Aig_ObjChild0Copy( pObj );
        pFanin1 = Aig_ObjChild1Copy( pObj );
        pObj->pData = Aig_TableLookupTwo( pAig1, pFanin0, pFanin1 );
        if ( pObj->pData == NULL )
        {
            if ( fVerbose )
                printf( "Structural equivalence failed at node %d.\n", i );
            return 0;
        }
    }
    // make sure the first PO points to the same node
    if ( Aig_ManCoNum(pAig1)-Aig_ManRegNum(pAig1) == 1 && Aig_ObjChild0Copy(Aig_ManCo(pAig2, 0)) != Aig_ObjChild0(Aig_ManCo(pAig1, 0)) )
    {
        if ( fVerbose )
            printf( "Structural equivalence failed at primary output 0.\n" );
        return 0;
    }
    return 1;    
}